

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::ContStack::Print(ContStack *this,DebugWriter *w,Char *input)

{
  Cont *pCVar1;
  size_t sVar2;
  Iterator local_48;
  
  local_48.super_Iterator.nextTop._0_4_ =
       (undefined4)
       (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
       super_ContinuousPageStack<1UL>.nextTop;
  local_48.super_Iterator.nextTop._4_4_ =
       *(undefined4 *)
        ((long)&(this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.nextTop + 4);
  local_48.topElementSize._0_4_ =
       (undefined4)
       (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize;
  local_48.topElementSize._4_4_ =
       *(undefined4 *)
        ((long)&(this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                topElementSize + 4);
  sVar2 = (this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop;
  local_48.stack = &this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>;
  while (sVar2 != 0) {
    DebugWriter::Print(w,L"%4llu: ");
    pCVar1 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator*
                       (&local_48);
    (**pCVar1->_vptr_Cont)(pCVar1,w,input);
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator++(&local_48);
    sVar2 = CONCAT44(local_48.super_Iterator.nextTop._4_4_,
                     (undefined4)local_48.super_Iterator.nextTop);
  }
  return;
}

Assistant:

void ContStack::Print(DebugWriter* w, const Char* const input) const
    {
        for (Iterator it(*this); it; ++it)
        {
            w->Print(_u("%4llu: "), static_cast<unsigned long long>(it.Position()));
            it->Print(w, input);
        }
    }